

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O0

void __thiscall D5xNvmFlash::erase(D5xNvmFlash *this,uint32_t offset,uint32_t size)

{
  uint uVar1;
  uint uVar2;
  FlashEraseError *pFVar3;
  uint local_34;
  uint32_t eraseNum;
  uint32_t eraseEnd;
  uint32_t eraseSize;
  uint32_t size_local;
  uint32_t offset_local;
  D5xNvmFlash *this_local;
  
  uVar1 = (this->super_Flash)._size * 0x10;
  if (offset % uVar1 != 0) {
    pFVar3 = (FlashEraseError *)__cxa_allocate_exception(8);
    FlashEraseError::FlashEraseError(pFVar3);
    __cxa_throw(pFVar3,&FlashEraseError::typeinfo,FlashEraseError::~FlashEraseError);
  }
  uVar2 = (*(this->super_Flash)._vptr_Flash[6])();
  if (uVar2 < offset + size) {
    pFVar3 = (FlashEraseError *)__cxa_allocate_exception(8);
    FlashEraseError::FlashEraseError(pFVar3);
    __cxa_throw(pFVar3,&FlashEraseError::typeinfo,FlashEraseError::~FlashEraseError);
  }
  for (local_34 = offset / uVar1; local_34 < ((offset + size + uVar1) - 1) / uVar1;
      local_34 = local_34 + 1) {
    writeRegU32(this,'\x14',local_34 * uVar1);
    command(this,'\x01');
  }
  return;
}

Assistant:

void
D5xNvmFlash::erase(uint32_t offset, uint32_t size)
{
    uint32_t eraseSize = _size * ERASE_BLOCK_PAGES;

    // Offset must be a multiple of the erase size
    if (offset % eraseSize)
        throw FlashEraseError();

    // Offset and size must be in range
    if (offset + size > totalSize())
        throw FlashEraseError();

    uint32_t eraseEnd = (offset + size + eraseSize - 1) / eraseSize;

    // Erase each erase size set of pages
    for (uint32_t eraseNum = offset / eraseSize; eraseNum < eraseEnd; eraseNum++)
    {
        // Issue erase command
        writeRegU32(NVM_REG_ADDR, eraseNum * eraseSize);
        command(NVM_CMD_EB);
    }
}